

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O1

void handle_parent(session_t *sess)

{
  char cVar1;
  int iVar2;
  in_addr iVar3;
  int iVar4;
  passwd *ppVar5;
  ulong uVar6;
  __user_cap_header_struct cap_header;
  sockaddr_in sStack_60;
  char acStack_50 [16];
  session_t *psStack_40;
  passwd *ppStack_38;
  
  ppVar5 = getpwnam("nobody");
  if (ppVar5 == (passwd *)0x0) {
    return;
  }
  uVar6 = (ulong)ppVar5->pw_gid;
  iVar2 = setegid(ppVar5->pw_gid);
  if (iVar2 < 0) {
    handle_parent_cold_2();
  }
  else {
    uVar6 = (ulong)ppVar5->pw_uid;
    iVar2 = seteuid(ppVar5->pw_uid);
    if (-1 < iVar2) {
      syscall(0x7e);
      do {
        cVar1 = priv_sock_get_cmd(sess->parent_fd);
        switch(cVar1) {
        case '\x01':
          privop_pasv_get_data_sock(sess);
          break;
        case '\x02':
          priv_sock_send_int(sess->parent_fd,(uint)(sess->pasv_listen_fd != -1));
          break;
        case '\x03':
          privop_pasv_listen(sess);
          break;
        case '\x04':
          privop_pasv_accept(sess);
        }
      } while( true );
    }
  }
  handle_parent_cold_1();
  psStack_40 = sess;
  ppStack_38 = ppVar5;
  iVar2 = priv_sock_get_int(*(int *)(uVar6 + 0x858));
  acStack_50[0] = '\0';
  acStack_50[1] = '\0';
  acStack_50[2] = '\0';
  acStack_50[3] = '\0';
  acStack_50[4] = '\0';
  acStack_50[5] = '\0';
  acStack_50[6] = '\0';
  acStack_50[7] = '\0';
  acStack_50[8] = '\0';
  acStack_50[9] = '\0';
  acStack_50[10] = '\0';
  acStack_50[0xb] = '\0';
  acStack_50[0xc] = '\0';
  acStack_50[0xd] = '\0';
  acStack_50[0xe] = '\0';
  acStack_50[0xf] = '\0';
  priv_sock_recv_buf(*(int *)(uVar6 + 0x858),acStack_50,0x10);
  sStack_60.sin_zero[0] = '\0';
  sStack_60.sin_zero[1] = '\0';
  sStack_60.sin_zero[2] = '\0';
  sStack_60.sin_zero[3] = '\0';
  sStack_60.sin_zero[4] = '\0';
  sStack_60.sin_zero[5] = '\0';
  sStack_60.sin_zero[6] = '\0';
  sStack_60.sin_zero[7] = '\0';
  sStack_60.sin_port = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
  sStack_60.sin_family = 2;
  sStack_60.sin_addr.s_addr = 0;
  iVar3.s_addr = inet_addr(acStack_50);
  sStack_60.sin_addr.s_addr = iVar3.s_addr;
  iVar2 = tcp_client(0x14);
  if (iVar2 == -1) {
    printf("tcp_client error data fd: %d\n",0xffffffff);
  }
  else {
    iVar4 = connect_timeout(iVar2,&sStack_60,tunable_connect_timeout);
    if (-1 < iVar4) {
      priv_sock_send_result(*(int *)(uVar6 + 0x858),'\x01');
      priv_sock_send_fd(*(int *)(uVar6 + 0x858),iVar2);
      close(iVar2);
      return;
    }
    puts("connect timeout");
    close(iVar2);
  }
  priv_sock_send_result(*(int *)(uVar6 + 0x858),'\x02');
  return;
}

Assistant:

void handle_parent(session_t *sess) {
  struct passwd *pw = getpwnam("nobody");
  if (pw == NULL)
    return;

  if (setegid(pw->pw_gid) < 0) {
    ERR_EXIT("setegid");
  }

  if (seteuid(pw->pw_uid) < 0) {
    ERR_EXIT("seteuid");
  }

  // add cur process bind 20 port privilege
  minimize_privilege();

  char cmd;
  while (1) {
    // 读取来自子进程的数据
    cmd = priv_sock_get_cmd(sess->parent_fd);
    //printf("cmd: %d\n", (int)cmd);
    // 解析内部命令
    switch (cmd) {
      case PRIV_SOCK_GET_DATA_SOCK:privop_pasv_get_data_sock(sess);
        break;
      case PRIV_SOCK_PASV_ACTIVE:privop_pasv_active(sess);
        break;
      case PRIV_SOCK_PASV_LISTEN:privop_pasv_listen(sess);
        break;
      case PRIV_SOCK_PASV_ACCEPT:privop_pasv_accept(sess);
        break;
    }

  }
}